

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.h
# Opt level: O2

void __thiscall SQTable::~SQTable(SQTable *this)

{
  long lVar1;
  SQInteger i;
  long lVar2;
  
  (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQTable_0013dc28;
  SQDelegable::SetDelegate(&this->super_SQDelegable,(SQTable *)0x0);
  if (((this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef & 0x80000000) == 0) {
    SQCollectable::RemoveFromChain
              (&((this->super_SQDelegable).super_SQCollectable._sharedstate)->_gc_chain,
               (SQCollectable_conflict *)this);
  }
  lVar1 = 0;
  lVar2 = 0;
  while( true ) {
    if (this->_numofnodes <= lVar2) break;
    _HashNode::~_HashNode((_HashNode *)((long)&(this->_nodes->val).super_SQObject._type + lVar1));
    lVar2 = lVar2 + 1;
    lVar1 = lVar1 + 0x28;
  }
  sq_vm_free(this->_nodes,this->_numofnodes * 0x28);
  SQRefCounted::~SQRefCounted((SQRefCounted *)this);
  return;
}

Assistant:

~SQTable()
    {
        SetDelegate(NULL);
        REMOVE_FROM_CHAIN(&_sharedstate->_gc_chain, this);
        for (SQInteger i = 0; i < _numofnodes; i++) _nodes[i].~_HashNode();
        SQ_FREE(_nodes, _numofnodes * sizeof(_HashNode));
    }